

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall cpptempl::TokenVar::gettext(TokenVar *this,ostream *stream,data_map *data)

{
  data_ptr local_70;
  string local_58 [32];
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)&this->m_key);
  parse_val(&local_70,&local_38,data);
  (*(local_70.ptr.super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Data
    [1])(local_58);
  std::operator<<(stream,local_58);
  std::__cxx11::string::~string(local_58);
  data_ptr::~data_ptr(&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

inline void TokenVar::gettext( std::ostream &stream, data_map &data )
    {
        stream << parse_val(m_key, data)->getvalue() ;
    }